

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::_::concat<kj::ArrayPtr<char_const>,kj::String>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,String *params_1)

{
  size_t size;
  char *target;
  initializer_list<unsigned_long> nums;
  undefined8 local_28;
  long local_20;
  
  local_28 = *(undefined8 *)(this + 8);
  local_20 = 0;
  if (params->size_ != 0) {
    local_20 = params->size_ - 1;
  }
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0x2;
  size = sum((_ *)&local_28,nums);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::String>(target,(ArrayPtr<const_char> *)this,(String *)params);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}